

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O1

Territory __thiscall QTimeZone::territory(QTimeZone *this)

{
  bool bVar1;
  Territory TVar2;
  int iVar3;
  long in_FS_OFFSET;
  QTimeZone QStack_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (((ulong)(this->d).d & 3) == 0) {
    if ((this->d).d != (QTimeZonePrivate *)0x0) {
      bVar1 = QTimeZonePrivate::isValid((this->d).d);
      if (bVar1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
          iVar3 = (*((this->d).d)->_vptr_QTimeZonePrivate[3])();
          return (Territory)iVar3;
        }
        goto LAB_00358489;
      }
    }
LAB_00358448:
    TVar2 = AnyCountry;
  }
  else {
    if (((int)(this->d).d - 1U & 3) != 0) goto LAB_00358448;
    systemTimeZone();
    TVar2 = territory(&QStack_18);
    ~QTimeZone(&QStack_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return TVar2;
  }
LAB_00358489:
  __stack_chk_fail();
}

Assistant:

QLocale::Territory QTimeZone::territory() const
{
    if (d.isShort()) {
        if (d.s.spec() == Qt::LocalTime)
            return systemTimeZone().territory();
    } else if (isValid()) {
        return d->territory();
    }
    return QLocale::AnyTerritory;
}